

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleSizeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  const_reference name;
  unsigned_long __val;
  char *value;
  string local_398;
  string local_378;
  ostringstream local_358 [8];
  ostringstream e_1;
  string *outputVariable;
  string *filename;
  undefined1 local_1c8 [4];
  uint argsIndex;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 3) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,1);
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
    bVar1 = cmsys::SystemTools::FileExists(pvVar3,true);
    if (bVar1) {
      this_00 = (this->super_cmCommand).Makefile;
      __val = cmsys::SystemTools::FileLength(pvVar3);
      std::__cxx11::to_string(&local_398,__val);
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,name,value);
      std::__cxx11::string::~string((string *)&local_398);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_358);
      poVar4 = std::operator<<((ostream *)local_358,
                               "SIZE requested of path that is not readable:\n  ");
      std::operator<<(poVar4,(string *)pvVar3);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream(local_358);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar4 = std::operator<<((ostream *)local_198,(string *)pvVar3);
    std::operator<<(poVar4," requires a file name and output variable");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileCommand::HandleSizeCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    std::ostringstream e;
    e << "SIZE requested of path that is not readable:\n  " << filename;
    this->SetError(e.str());
    return false;
  }

  this->Makefile->AddDefinition(
    outputVariable,
    std::to_string(cmSystemTools::FileLength(filename)).c_str());

  return true;
}